

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_muls2_i32_arm
               (TCGContext_conflict *tcg_ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGOp *pTVar1;
  uintptr_t o_3;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  
  pTVar1 = tcg_emit_op_arm(tcg_ctx,INDEX_op_muls2_i32);
  pTVar1->args[0] = (TCGArg)(rl + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(rh + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1->args[3] = (TCGArg)(arg2 + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_muls2_i32(TCGContext *tcg_ctx, TCGv_i32 rl, TCGv_i32 rh, TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (TCG_TARGET_HAS_muls2_i32) {
        tcg_gen_op4_i32(tcg_ctx, INDEX_op_muls2_i32, rl, rh, arg1, arg2);
    } else if (TCG_TARGET_HAS_mulsh_i32) {
        TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_op3_i32(tcg_ctx, INDEX_op_mul_i32, t, arg1, arg2);
        tcg_gen_op3_i32(tcg_ctx, INDEX_op_mulsh_i32, rh, arg1, arg2);
        tcg_gen_mov_i32(tcg_ctx, rl, t);
        tcg_temp_free_i32(tcg_ctx, t);
    } else if (TCG_TARGET_REG_BITS == 32) {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_mulu2_i32(tcg_ctx, t0, t1, arg1, arg2);
        /* Adjust for negative inputs.  */
        tcg_gen_sari_i32(tcg_ctx, t2, arg1, 31);
        tcg_gen_sari_i32(tcg_ctx, t3, arg2, 31);
        tcg_gen_and_i32(tcg_ctx, t2, t2, arg2);
        tcg_gen_and_i32(tcg_ctx, t3, t3, arg1);
        tcg_gen_sub_i32(tcg_ctx, rh, t1, t2);
        tcg_gen_sub_i32(tcg_ctx, rh, rh, t3);
        tcg_gen_mov_i32(tcg_ctx, rl, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
        tcg_temp_free_i32(tcg_ctx, t2);
        tcg_temp_free_i32(tcg_ctx, t3);
    } else {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_ext_i32_i64(tcg_ctx, t0, arg1);
        tcg_gen_ext_i32_i64(tcg_ctx, t1, arg2);
        tcg_gen_mul_i64(tcg_ctx, t0, t0, t1);
        tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
    }
}